

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scrambler.cxx
# Opt level: O3

void __thiscall xray_re::xr_scrambler::init_sboxes(xr_scrambler *this,int seed,int size_mult)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [11];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  int i;
  uint uVar31;
  long lVar32;
  uint uVar33;
  int iVar34;
  undefined1 auVar35 [16];
  char cVar37;
  char cVar38;
  char cVar39;
  char cVar40;
  char cVar41;
  char cVar42;
  char cVar43;
  undefined1 auVar36 [16];
  undefined1 auVar44 [11];
  char cVar50;
  byte bVar51;
  char cVar52;
  char cVar53;
  char cVar54;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar45 [15];
  char cVar48;
  byte bVar49;
  
  lVar32 = 0x100;
  auVar35 = _DAT_001f4150;
  do {
    cVar43 = auVar35[7];
    auVar19[0xd] = 0;
    auVar19._0_13_ = auVar35._0_13_;
    auVar19[0xe] = cVar43;
    cVar42 = auVar35[6];
    auVar20[0xc] = cVar42;
    auVar20._0_12_ = auVar35._0_12_;
    auVar20._13_2_ = auVar19._13_2_;
    auVar21[0xb] = 0;
    auVar21._0_11_ = auVar35._0_11_;
    auVar21._12_3_ = auVar20._12_3_;
    cVar41 = auVar35[5];
    auVar22[10] = cVar41;
    auVar22._0_10_ = auVar35._0_10_;
    auVar22._11_4_ = auVar21._11_4_;
    auVar23[9] = 0;
    auVar23._0_9_ = auVar35._0_9_;
    auVar23._10_5_ = auVar22._10_5_;
    cVar40 = auVar35[4];
    auVar24[8] = cVar40;
    auVar24._0_8_ = auVar35._0_8_;
    auVar24._9_6_ = auVar23._9_6_;
    auVar36[7] = 0;
    auVar36._0_7_ = auVar24._8_7_;
    auVar27._7_8_ = 0;
    auVar27._0_7_ = auVar24._8_7_;
    cVar39 = auVar35[3];
    auVar29._1_8_ = SUB158(auVar27 << 0x40,7);
    auVar29[0] = cVar39;
    auVar29._9_6_ = 0;
    cVar38 = auVar35[2];
    auVar28._1_10_ = SUB1510(auVar29 << 0x30,5);
    auVar28[0] = cVar38;
    auVar30._11_4_ = 0;
    auVar30._0_11_ = auVar28;
    cVar37 = auVar35[1];
    auVar25[2] = cVar37;
    auVar25._0_2_ = auVar35._0_2_;
    auVar25._3_12_ = SUB1512(auVar30 << 0x20,3);
    auVar26._2_13_ = auVar25._2_13_;
    auVar26._0_2_ = auVar35._0_2_ & 0xff;
    auVar36._8_4_ = auVar26._0_4_;
    auVar36._12_4_ = auVar28._0_4_;
    auVar36 = pshuflw(auVar36,auVar36,0x1b);
    auVar36 = pshufhw(auVar36,auVar36,0x1b);
    auVar46[8] = auVar35[8];
    auVar46[9] = 0;
    cVar48 = auVar35[9];
    auVar46[10] = cVar48;
    bVar49 = auVar35[10];
    cVar50 = auVar35[0xb];
    bVar51 = auVar35[0xc];
    auVar44._0_10_ = (unkuint10)bVar51 << 0x40;
    cVar52 = auVar35[0xd];
    auVar44[10] = cVar52;
    auVar45[0xb] = 0;
    auVar45._0_11_ = auVar44;
    cVar53 = auVar35[0xe];
    auVar45[0xc] = cVar53;
    auVar45[0xd] = 0;
    cVar54 = auVar35[0xf];
    auVar45[0xe] = cVar54;
    auVar46[3] = 0;
    auVar46._0_3_ = auVar44._8_3_;
    auVar46._4_3_ = auVar45._12_3_;
    auVar46[7] = 0;
    auVar46[0xb] = 0;
    auVar46._12_3_ = (int3)(CONCAT16(cVar50,(uint6)bVar49 << 0x20) >> 0x20);
    auVar46[0xf] = 0;
    auVar47 = pshuflw(auVar46,auVar46,0x1b);
    auVar47 = pshufhw(auVar47,auVar47,0x1b);
    sVar3 = auVar47._0_2_;
    sVar4 = auVar47._2_2_;
    sVar5 = auVar47._4_2_;
    sVar6 = auVar47._6_2_;
    sVar7 = auVar47._8_2_;
    sVar8 = auVar47._10_2_;
    sVar9 = auVar47._12_2_;
    sVar10 = auVar47._14_2_;
    sVar11 = auVar36._0_2_;
    sVar12 = auVar36._2_2_;
    sVar13 = auVar36._4_2_;
    sVar14 = auVar36._6_2_;
    sVar15 = auVar36._8_2_;
    sVar16 = auVar36._10_2_;
    sVar17 = auVar36._12_2_;
    sVar18 = auVar36._14_2_;
    puVar1 = this->m_enc_sbox + lVar32 + -0x10;
    *puVar1 = (0 < sVar3) * (sVar3 < 0x100) * auVar47[0] - (0xff < sVar3);
    puVar1[1] = (0 < sVar4) * (sVar4 < 0x100) * auVar47[2] - (0xff < sVar4);
    puVar1[2] = (0 < sVar5) * (sVar5 < 0x100) * auVar47[4] - (0xff < sVar5);
    puVar1[3] = (0 < sVar6) * (sVar6 < 0x100) * auVar47[6] - (0xff < sVar6);
    puVar1[4] = (0 < sVar7) * (sVar7 < 0x100) * auVar47[8] - (0xff < sVar7);
    puVar1[5] = (0 < sVar8) * (sVar8 < 0x100) * auVar47[10] - (0xff < sVar8);
    puVar1[6] = (0 < sVar9) * (sVar9 < 0x100) * auVar47[0xc] - (0xff < sVar9);
    puVar1[7] = (0 < sVar10) * (sVar10 < 0x100) * auVar47[0xe] - (0xff < sVar10);
    puVar1[8] = (0 < sVar11) * (sVar11 < 0x100) * auVar36[0] - (0xff < sVar11);
    puVar1[9] = (0 < sVar12) * (sVar12 < 0x100) * auVar36[2] - (0xff < sVar12);
    puVar1[10] = (0 < sVar13) * (sVar13 < 0x100) * auVar36[4] - (0xff < sVar13);
    puVar1[0xb] = (0 < sVar14) * (sVar14 < 0x100) * auVar36[6] - (0xff < sVar14);
    puVar1[0xc] = (0 < sVar15) * (sVar15 < 0x100) * auVar36[8] - (0xff < sVar15);
    puVar1[0xd] = (0 < sVar16) * (sVar16 < 0x100) * auVar36[10] - (0xff < sVar16);
    puVar1[0xe] = (0 < sVar17) * (sVar17 < 0x100) * auVar36[0xc] - (0xff < sVar17);
    puVar1[0xf] = (0 < sVar18) * (sVar18 < 0x100) * auVar36[0xe] - (0xff < sVar18);
    auVar35[0] = auVar35[0] + -0x10;
    auVar35[1] = cVar37 + -0x10;
    auVar35[2] = cVar38 + -0x10;
    auVar35[3] = cVar39 + -0x10;
    auVar35[4] = cVar40 + -0x10;
    auVar35[5] = cVar41 + -0x10;
    auVar35[6] = cVar42 + -0x10;
    auVar35[7] = cVar43 + -0x10;
    auVar35[8] = auVar46[8] - 0x10;
    auVar35[9] = cVar48 + -0x10;
    auVar35[10] = bVar49 - 0x10;
    auVar35[0xb] = cVar50 + -0x10;
    auVar35[0xc] = bVar51 - 0x10;
    auVar35[0xd] = cVar52 + -0x10;
    auVar35[0xe] = cVar53 + -0x10;
    auVar35[0xf] = cVar54 + -0x10;
    lVar32 = lVar32 + -0x10;
  } while (lVar32 != 0);
  if (size_mult != 0) {
    iVar34 = size_mult << 8;
    do {
      seed = seed * 0x8088405 + 1;
      uVar31 = (uint)seed >> 0x18;
      do {
        seed = seed * 0x8088405 + 1;
        uVar33 = (uint)seed >> 0x18;
      } while (uVar31 == uVar33);
      uVar2 = this->m_enc_sbox[uVar31];
      this->m_enc_sbox[uVar31] = this->m_enc_sbox[uVar33];
      this->m_enc_sbox[uVar33] = uVar2;
      iVar34 = iVar34 + -1;
    } while (iVar34 != 0);
  }
  lVar32 = 0;
  do {
    this->m_dec_sbox[this->m_enc_sbox[lVar32]] = (uint8_t)lVar32;
    lVar32 = lVar32 + 1;
  } while (lVar32 != 0x100);
  return;
}

Assistant:

void xr_scrambler::init_sboxes(int seed, int size_mult)
{
	for (int i = SBOX_SIZE - 1; i >= 0; --i)
		m_enc_sbox[i] = uint8_t(i);
	for (int i = size_mult*SBOX_SIZE, a, b; i != 0; --i) {
		seed = 1 + seed * SEED_MULT;
		a = (seed >> 24) & 0xff;
		do {
			seed = 1 + seed * SEED_MULT;
			b = (seed >> 24) & 0xff;
		} while (a == b);
		std::swap(m_enc_sbox[a], m_enc_sbox[b]);
	}
	for (int i = 0; i != SBOX_SIZE; ++i)
		m_dec_sbox[m_enc_sbox[i]] = uint8_t(i);
}